

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

void __thiscall Am_Connection::Decrement_Check_List(Am_Connection *this)

{
  Incomplete_List_Ptr piVar1;
  Am_Connection_Data *pAVar2;
  incomplete_list_node *this_00;
  unsigned_long uVar3;
  Am_Wrapper *value;
  Incomplete_List_Ptr temp;
  Am_Connection *this_local;
  
  piVar1 = this->data->List_Queue;
  uVar3 = piVar1->length - 1;
  piVar1->length = uVar3;
  if (uVar3 == 0) {
    pAVar2 = this->data;
    value = Am_Value_List::operator_cast_to_Am_Wrapper_(&this->data->List_Queue->list);
    Am_Value_List::Push(&pAVar2->Value_Queue,value,true);
    piVar1 = this->data->List_Queue;
    pAVar2 = this->data;
    (pAVar2->my_receiver).from_wrapper = (piVar1->prev_receiver).from_wrapper;
    (pAVar2->my_receiver).Call = (piVar1->prev_receiver).Call;
    this_00 = this->data->List_Queue;
    this->data->List_Queue = this->data->List_Queue->next;
    if (this_00 != (incomplete_list_node *)0x0) {
      incomplete_list_node::~incomplete_list_node(this_00);
      operator_delete(this_00);
    }
    (*(this->data->my_receiver).Call)(this);
  }
  return;
}

Assistant:

void
Am_Connection::Decrement_Check_List()
{
  if ((--(data->List_Queue->length)) == 0) {
    data->Value_Queue.Push(data->List_Queue->list);
    data->my_receiver = data->List_Queue->prev_receiver;
    Incomplete_List_Ptr temp = data->List_Queue;
    data->List_Queue = data->List_Queue->next;
    delete (temp);
    data->my_receiver.Call(this); // Now that we have the list, let the
                                  // user fn take it.
  }
}